

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)2> *Ser,
               ConstQual<RayTracingPipelineStateCreateInfo> *CreateInfo,
               ConstQual<TPRSNames> *PRSNames,DynamicLinearAllocator *Allocator,
               function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *ShaderToIndex)

{
  anon_class_24_3_79790419 ElemSerializer;
  anon_class_24_3_79790419 ElemSerializer_00;
  anon_class_24_3_79790419 ElemSerializer_01;
  bool bVar1;
  byte local_3a;
  bool local_39;
  bool res;
  bool IsWriting;
  function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *pfStack_38;
  bool IsReading;
  function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *ShaderToIndex_local;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<TPRSNames> *PRSNames_local;
  ConstQual<RayTracingPipelineStateCreateInfo> *CreateInfo_local;
  Serializer<(Diligent::SerializerMode)2> *Ser_local;
  
  local_39 = Allocator != (DynamicLinearAllocator *)0x0;
  local_3a = (local_39 ^ 0xffU) & 1;
  pfStack_38 = ShaderToIndex;
  ShaderToIndex_local = (function<void_(unsigned_int_&,_Diligent::IShader_*const_&)> *)Allocator;
  Allocator_local = (DynamicLinearAllocator *)PRSNames;
  PRSNames_local = (ConstQual<TPRSNames> *)CreateInfo;
  CreateInfo_local = (ConstQual<RayTracingPipelineStateCreateInfo> *)Ser;
  bVar1 = SerializeCreateInfo(Ser,&CreateInfo->super_PipelineStateCreateInfo,PRSNames,Allocator);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                      ((Serializer<(Diligent::SerializerMode)2> *)CreateInfo_local,
                       (unsigned_short *)(PRSNames_local[1]._M_elems + 4),
                       (uchar *)((long)PRSNames_local[1]._M_elems + 0x22));
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                        ((Serializer<(Diligent::SerializerMode)2> *)CreateInfo_local,
                         PRSNames_local[2]._M_elems + 3,(uint *)(PRSNames_local[2]._M_elems + 4),
                         (uint *)((long)PRSNames_local[2]._M_elems + 0x24));
      if (bVar1) {
        ElemSerializer.ShaderToIndex = pfStack_38;
        ElemSerializer.IsWriting = (bool *)&local_3a;
        ElemSerializer.IsReading = &local_39;
        bVar1 = Serializer<(Diligent::SerializerMode)2>::
                SerializeArray<Diligent::RayTracingGeneralShaderGroup_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingPipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*,std::function<void(unsigned_int&,Diligent::IShader*const&)>const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingGeneralShaderGroup_const&)_1_>
                          ((Serializer<(Diligent::SerializerMode)2> *)CreateInfo_local,
                           (DynamicLinearAllocator *)ShaderToIndex_local,
                           (RayTracingGeneralShaderGroup **)(PRSNames_local[1]._M_elems + 5),
                           (uint *)(PRSNames_local[1]._M_elems + 6),ElemSerializer);
        if (bVar1) {
          ElemSerializer_00.ShaderToIndex = pfStack_38;
          ElemSerializer_00.IsWriting = (bool *)&local_3a;
          ElemSerializer_00.IsReading = &local_39;
          bVar1 = Serializer<(Diligent::SerializerMode)2>::
                  SerializeArray<Diligent::RayTracingTriangleHitShaderGroup_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingPipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*,std::function<void(unsigned_int&,Diligent::IShader*const&)>const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingTriangleHitShaderGroup_const&)_1_>
                            ((Serializer<(Diligent::SerializerMode)2> *)CreateInfo_local,
                             (DynamicLinearAllocator *)ShaderToIndex_local,
                             (RayTracingTriangleHitShaderGroup **)(PRSNames_local[1]._M_elems + 7),
                             (uint *)(PRSNames_local + 2),ElemSerializer_00);
          if (bVar1) {
            ElemSerializer_01.ShaderToIndex = pfStack_38;
            ElemSerializer_01.IsWriting = (bool *)&local_3a;
            ElemSerializer_01.IsReading = &local_39;
            Ser_local._7_1_ =
                 Serializer<(Diligent::SerializerMode)2>::
                 SerializeArray<Diligent::RayTracingProceduralHitShaderGroup_const*const,unsigned_int_const,Diligent::PSOSerializer<(Diligent::SerializerMode)2>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingPipelineStateCreateInfo_const&,std::array<char_const*,8ul>const&,Diligent::DynamicLinearAllocator*,std::function<void(unsigned_int&,Diligent::IShader*const&)>const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,Diligent::RayTracingProceduralHitShaderGroup_const&)_1_>
                           ((Serializer<(Diligent::SerializerMode)2> *)CreateInfo_local,
                            (DynamicLinearAllocator *)ShaderToIndex_local,
                            (RayTracingProceduralHitShaderGroup **)(PRSNames_local[2]._M_elems + 1),
                            (uint *)(PRSNames_local[2]._M_elems + 2),ElemSerializer_01);
          }
          else {
            Ser_local._7_1_ = false;
          }
        }
        else {
          Ser_local._7_1_ = false;
        }
      }
      else {
        Ser_local._7_1_ = false;
      }
    }
    else {
      Ser_local._7_1_ = false;
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                                         Ser,
    ConstQual<RayTracingPipelineStateCreateInfo>&             CreateInfo,
    ConstQual<TPRSNames>&                                     PRSNames,
    DynamicLinearAllocator*                                   Allocator,
    const std::function<void(Uint32&, ConstQual<IShader*>&)>& ShaderToIndex)
{
    const bool IsReading = (Allocator != nullptr);
    const bool IsWriting = !IsReading;

    if (!SerializeCreateInfo(Ser, static_cast<ConstQual<PipelineStateCreateInfo>&>(CreateInfo), PRSNames, Allocator))
        return false;

    // Serialize RayTracingPipelineDesc
    if (!Ser(CreateInfo.RayTracingPipeline.ShaderRecordSize,
             CreateInfo.RayTracingPipeline.MaxRecursionDepth))
        return false;

    // Serialize RayTracingPipelineStateCreateInfo
    if (!Ser(CreateInfo.pShaderRecordName,
             CreateInfo.MaxAttributeSize,
             CreateInfo.MaxPayloadSize))
        return false;

    // Serialize RayTracingGeneralShaderGroup
    auto res =
        Ser.SerializeArray(Allocator, CreateInfo.pGeneralShaders, CreateInfo.GeneralShaderCount,
                           [&](Serializer<Mode>&                        Ser,
                               ConstQual<RayTracingGeneralShaderGroup>& Group) //
                           {
                               Uint32 ShaderIndex = ~0u;
                               if (IsWriting)
                               {
                                   ShaderToIndex(ShaderIndex, Group.pShader);
                               }

                               if (!Ser(Group.Name, ShaderIndex))
                                   return false;

                               VERIFY_EXPR(ShaderIndex != ~0u);
                               if (IsReading)
                               {
                                   ShaderToIndex(ShaderIndex, Group.pShader);
                               }

                               return true;
                           });
    if (!res) return false;

    // Serialize RayTracingTriangleHitShaderGroup
    res =
        Ser.SerializeArray(Allocator, CreateInfo.pTriangleHitShaders, CreateInfo.TriangleHitShaderCount,
                           [&](Serializer<Mode>&                            Ser,
                               ConstQual<RayTracingTriangleHitShaderGroup>& Group) //
                           {
                               Uint32 ClosestHitShaderIndex = ~0u;
                               Uint32 AnyHitShaderIndex     = ~0u;
                               if (IsWriting)
                               {
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               if (!Ser(Group.Name, ClosestHitShaderIndex, AnyHitShaderIndex))
                                   return false;

                               VERIFY_EXPR(ClosestHitShaderIndex != ~0u);
                               if (IsReading)
                               {
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               return true;
                           });
    if (!res) return false;

    // Serialize RayTracingProceduralHitShaderGroup
    res =
        Ser.SerializeArray(Allocator, CreateInfo.pProceduralHitShaders, CreateInfo.ProceduralHitShaderCount,
                           [&](Serializer<Mode>&                              Ser,
                               ConstQual<RayTracingProceduralHitShaderGroup>& Group) //
                           {
                               Uint32 IntersectionShaderIndex = ~0u;
                               Uint32 ClosestHitShaderIndex   = ~0u;
                               Uint32 AnyHitShaderIndex       = ~0u;
                               if (IsWriting)
                               {
                                   ShaderToIndex(IntersectionShaderIndex, Group.pIntersectionShader);
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               if (!Ser(Group.Name, IntersectionShaderIndex, ClosestHitShaderIndex, AnyHitShaderIndex))
                                   return false;

                               VERIFY_EXPR(IntersectionShaderIndex != ~0u);
                               if (IsReading)
                               {
                                   ShaderToIndex(IntersectionShaderIndex, Group.pIntersectionShader);
                                   ShaderToIndex(ClosestHitShaderIndex, Group.pClosestHitShader);
                                   ShaderToIndex(AnyHitShaderIndex, Group.pAnyHitShader);
                               }

                               return true;
                           });
    return res;

    ASSERT_SIZEOF64(RayTracingPipelineStateCreateInfo, 168, "Did you add a new member to RayTracingPipelineStateCreateInfo? Please add serialization here.");
    ASSERT_SIZEOF64(RayTracingGeneralShaderGroup, 16, "Did you add a new member to RayTracingGeneralShaderGroup? Please add serialization here.");
    ASSERT_SIZEOF64(RayTracingTriangleHitShaderGroup, 24, "Did you add a new member to RayTracingTriangleHitShaderGroup? Please add serialization here.");
    ASSERT_SIZEOF64(RayTracingProceduralHitShaderGroup, 32, "Did you add a new member to RayTracingProceduralHitShaderGroup? Please add serialization here.");
}